

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int fits_img_stats_short
              (short *array,long nx,long ny,int nullcheck,short nullvalue,long *ngoodpix,
              short *minvalue,short *maxvalue,double *mean,double *sigma,double *noise1,
              double *noise2,double *noise3,double *noise5,int *status)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  void *__ptr;
  double *pdVar11;
  size_t sVar12;
  double *arr;
  double *arr_00;
  double *__ptr_00;
  double *__base;
  double *__base_00;
  size_t sVar13;
  size_t sVar14;
  ushort uVar15;
  ulong uVar16;
  ulong uVar17;
  short sVar18;
  ushort uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  short sVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  int iVar29;
  short sVar30;
  uint uVar31;
  size_t __nmemb;
  uint uVar32;
  ulong uVar33;
  short *psVar34;
  double dVar35;
  double dVar36;
  long local_d8;
  double dStack_b0;
  uint local_94;
  size_t local_78;
  uint local_70;
  long local_68;
  size_t local_60;
  uint local_4c;
  long local_48;
  
  local_d8 = nx;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    lVar10 = ny * nx;
    if (nullcheck == 0) {
      if (0 < lVar10) {
        dVar35 = 0.0;
        lVar23 = 0;
        dVar36 = 0.0;
        do {
          dVar5 = (double)(int)array[lVar23];
          dVar36 = dVar36 + dVar5;
          dVar35 = dVar35 + dVar5 * dVar5;
          lVar23 = lVar23 + 1;
          local_d8 = lVar10;
        } while (lVar10 - lVar23 != 0);
        goto LAB_001f8654;
      }
LAB_001f8697:
      dVar36 = 0.0;
      local_d8 = 0;
      dVar35 = 0.0;
    }
    else {
      if (lVar10 < 1) goto LAB_001f8697;
      dVar35 = 0.0;
      local_d8 = 0;
      dVar36 = 0.0;
      lVar23 = 0;
      do {
        if (array[lVar23] != nullvalue) {
          dVar5 = (double)(int)array[lVar23];
          local_d8 = local_d8 + 1;
          dVar36 = dVar36 + dVar5;
          dVar35 = dVar35 + dVar5 * dVar5;
        }
        lVar23 = lVar23 + 1;
      } while (lVar10 - lVar23 != 0);
LAB_001f8654:
      if (local_d8 < 2) {
        if (local_d8 != 1) goto LAB_001f8697;
        dVar35 = 0.0;
        local_d8 = 1;
      }
      else {
        dVar36 = dVar36 / (double)local_d8;
        dVar35 = dVar35 / (double)local_d8 - dVar36 * dVar36;
        if (dVar35 < 0.0) {
          dVar35 = sqrt(dVar35);
        }
        else {
          dVar35 = SQRT(dVar35);
        }
      }
    }
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = local_d8;
    }
    if (mean != (double *)0x0) {
      *mean = dVar36;
    }
    if (sigma != (double *)0x0) {
      *sigma = dVar35;
    }
  }
  if (noise1 != (double *)0x0) {
    dVar35 = 0.0;
    if (2 < nx) {
      __ptr = calloc(nx,2);
      if (__ptr != (void *)0x0) {
        pdVar11 = (double *)calloc(ny,8);
        if (pdVar11 != (double *)0x0) {
          if (ny < 1) {
            dVar35 = 0.0;
          }
          else {
            sVar12 = 0;
            lVar10 = 0;
            psVar34 = array;
            do {
              lVar23 = 0;
              if (nullcheck == 0) {
LAB_001f87e7:
                if ((lVar23 != nx) && (lVar28 = lVar23 + 1, lVar28 < nx)) {
                  uVar17 = 0;
                  sVar30 = array[lVar10 * nx + lVar23];
                  do {
                    if ((nullcheck != 0) && (lVar28 < nx)) {
                      while (psVar34[lVar28] == nullvalue) {
                        lVar28 = lVar28 + 1;
                        if (nx == lVar28) goto LAB_001f8852;
                      }
                    }
                    if (lVar28 == nx) break;
                    sVar18 = array[lVar10 * nx + lVar28];
                    *(short *)((long)__ptr + uVar17 * 2) = sVar30 - sVar18;
                    uVar17 = uVar17 + 1;
                    lVar28 = lVar28 + 1;
                    sVar30 = sVar18;
                  } while (lVar28 < nx);
LAB_001f8852:
                  if (1 < uVar17) {
                    dVar35 = 0.0;
                    dVar36 = 0.0;
                    uVar16 = 0;
                    do {
                      dVar5 = (double)(int)*(short *)((long)__ptr + uVar16 * 2);
                      dVar36 = dVar36 + dVar5;
                      dVar35 = dVar35 + dVar5 * dVar5;
                      uVar16 = uVar16 + 1;
                    } while (uVar17 != uVar16);
                    dVar36 = dVar36 / (double)(long)uVar17;
                    dVar35 = dVar35 / (double)(long)uVar17 - dVar36 * dVar36;
                    if (dVar35 < 0.0) {
                      dVar35 = sqrt(dVar35);
                    }
                    else {
                      dVar35 = SQRT(dVar35);
                    }
                    if (0.0 < dVar35) {
                      iVar9 = 0;
                      do {
                        if ((long)uVar17 < 1) {
                          if (uVar17 == 0) break;
                          uVar33 = 0;
LAB_001f8914:
                          dVar36 = 0.0;
                          dVar35 = 0.0;
                          uVar17 = uVar33;
                        }
                        else {
                          uVar16 = 0;
                          uVar33 = 0;
                          do {
                            sVar30 = *(short *)((long)__ptr + uVar16 * 2);
                            if (ABS((double)(int)sVar30 - dVar36) < dVar35 * 5.0) {
                              if ((long)uVar33 < (long)uVar16) {
                                *(short *)((long)__ptr + uVar33 * 2) = sVar30;
                              }
                              uVar33 = uVar33 + 1;
                            }
                            uVar16 = uVar16 + 1;
                          } while (uVar17 != uVar16);
                          if (uVar33 == uVar17) break;
                          if ((long)uVar33 < 1) goto LAB_001f8914;
                          dVar35 = 0.0;
                          dVar36 = 0.0;
                          uVar17 = 0;
                          do {
                            dVar5 = (double)(int)*(short *)((long)__ptr + uVar17 * 2);
                            dVar36 = dVar36 + dVar5;
                            dVar35 = dVar35 + dVar5 * dVar5;
                            uVar17 = uVar17 + 1;
                          } while (uVar33 != uVar17);
                          if (uVar33 == 1) {
                            dVar35 = 0.0;
                            uVar17 = 1;
                          }
                          else {
                            dVar36 = dVar36 / (double)(long)uVar33;
                            dVar35 = dVar35 / (double)(long)uVar33 - dVar36 * dVar36;
                            uVar17 = uVar33;
                            if (dVar35 < 0.0) {
                              dVar35 = sqrt(dVar35);
                            }
                            else {
                              dVar35 = SQRT(dVar35);
                            }
                          }
                        }
                        iVar9 = iVar9 + 1;
                      } while (iVar9 != 3);
                    }
                    pdVar11[sVar12] = dVar35;
                    sVar12 = sVar12 + 1;
                  }
                }
              }
              else {
                do {
                  if (psVar34[lVar23] != nullvalue) goto LAB_001f87e7;
                  lVar23 = lVar23 + 1;
                } while (nx != lVar23);
              }
              lVar10 = lVar10 + 1;
              psVar34 = psVar34 + nx;
            } while (lVar10 != ny);
            if (sVar12 == 0) {
              dVar35 = 0.0;
            }
            else if (sVar12 == 1) {
              dVar35 = *pdVar11;
            }
            else {
              qsort(pdVar11,sVar12,8,FnCompare_double);
              dVar35 = (*(double *)
                         ((long)pdVar11 +
                         ((sVar12 - ((long)(sVar12 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe) * 4) +
                       *(double *)
                        ((long)pdVar11 + (sVar12 - ((long)sVar12 >> 0x3f) & 0xfffffffffffffffe) * 4)
                       ) * 0.5;
            }
          }
          dVar35 = dVar35 * 0.70710678;
          free(pdVar11);
          free(__ptr);
          goto LAB_001f8b81;
        }
        free(__ptr);
      }
      *status = 0x71;
      dVar35 = 0.0;
    }
LAB_001f8b81:
    *noise1 = dVar35;
  }
  if ((minvalue == (short *)0x0 && maxvalue == (short *)0x0) && noise3 == (double *)0x0)
  goto LAB_001f9418;
  lVar10 = 1;
  sVar12 = ny;
  if (nx < 9) {
    sVar12 = 1;
    lVar10 = ny;
  }
  __nmemb = lVar10 * nx;
  if ((long)__nmemb < 9) {
    dVar35 = 0.0;
    dStack_b0 = 0.0;
    dVar36 = 0.0;
    if ((long)__nmemb < 1) {
      sVar18 = -0x8000;
      sVar30 = 0x7fff;
      local_d8 = 0;
      dVar35 = 0.0;
      dStack_b0 = 0.0;
    }
    else {
      sVar30 = 0x7fff;
      sVar18 = -0x8000;
      lVar10 = 0;
      local_d8 = 0;
      do {
        sVar24 = array[lVar10];
        if ((nullcheck == 0) || (sVar24 != nullvalue)) {
          if (sVar24 < sVar30) {
            sVar30 = sVar24;
          }
          if (sVar18 < sVar24) {
            sVar18 = sVar24;
          }
          local_d8 = local_d8 + 1;
        }
        lVar10 = lVar10 + 1;
      } while (__nmemb - lVar10 != 0);
    }
  }
  else {
    pdVar11 = (double *)calloc(__nmemb,4);
    if (pdVar11 != (double *)0x0) {
      arr = (double *)calloc(__nmemb,4);
      if (arr != (double *)0x0) {
        arr_00 = (double *)calloc(__nmemb,4);
        if (arr_00 == (double *)0x0) {
          free(pdVar11);
          pdVar11 = arr;
        }
        else {
          __ptr_00 = (double *)calloc(sVar12,8);
          if (__ptr_00 == (double *)0x0) {
            free(pdVar11);
            free(arr);
            pdVar11 = arr_00;
          }
          else {
            __base = (double *)calloc(sVar12,8);
            if (__base == (double *)0x0) {
              free(pdVar11);
              free(arr);
              free(arr_00);
              pdVar11 = __ptr_00;
            }
            else {
              __base_00 = (double *)calloc(sVar12,8);
              if (__base_00 != (double *)0x0) {
                dVar36 = 0.0;
                if ((long)sVar12 < 1) {
                  dVar35 = 0.0;
                  dStack_b0 = 0.0;
                  sVar18 = -0x8000;
                  sVar30 = 0x7fff;
                  local_d8 = 0;
                }
                else {
                  uVar31 = 0x7fff;
                  uVar20 = 0x8000;
                  sVar14 = 0;
                  local_60 = 0;
                  local_78 = 0;
                  lVar10 = 0;
                  psVar34 = array;
                  do {
                    local_d8 = lVar10;
                    if (nullcheck == 0) {
                      sVar13 = 0;
LAB_001f8d30:
                      if (sVar13 != __nmemb) {
                        lVar23 = sVar14 * __nmemb;
                        uVar15 = array[lVar23 + sVar13];
                        if ((short)uVar15 < (short)uVar31) {
                          uVar31 = (uint)uVar15;
                        }
                        uVar26 = (uint)uVar15;
                        if ((short)uVar15 <= (short)uVar20) {
                          uVar26 = uVar20;
                        }
                        sVar13 = sVar13 + 1;
                        local_d8 = lVar10 + 1;
                        uVar20 = uVar26;
                        if ((long)sVar13 < (long)__nmemb && nullcheck != 0) {
                          do {
                            if (psVar34[sVar13] != nullvalue) goto LAB_001f8d97;
                            sVar13 = sVar13 + 1;
                          } while (__nmemb - sVar13 != 0);
                        }
                        else {
LAB_001f8d97:
                          if (sVar13 != __nmemb) {
                            uVar19 = array[lVar23 + sVar13];
                            if ((short)uVar19 < (short)uVar31) {
                              uVar31 = (uint)uVar19;
                            }
                            uVar20 = (uint)uVar19;
                            if ((short)uVar19 <= (short)uVar26) {
                              uVar20 = uVar26;
                            }
                            sVar13 = sVar13 + 1;
                            local_d8 = lVar10 + 2;
                            if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar13)) {
LAB_001f8de1:
                              if (sVar13 != __nmemb) {
                                uVar1 = array[lVar23 + sVar13];
                                if ((short)uVar1 < (short)uVar31) {
                                  uVar31 = (uint)uVar1;
                                }
                                uVar26 = (uint)uVar1;
                                if ((short)uVar1 <= (short)uVar20) {
                                  uVar26 = uVar20;
                                }
                                sVar13 = sVar13 + 1;
                                local_d8 = lVar10 + 3;
                                uVar20 = uVar26;
                                if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar13)) {
LAB_001f8e3a:
                                  if (sVar13 != __nmemb) {
                                    uVar2 = array[lVar23 + sVar13];
                                    if ((short)uVar2 < (short)uVar31) {
                                      uVar31 = (uint)uVar2;
                                    }
                                    uVar20 = (uint)uVar2;
                                    if ((short)uVar2 <= (short)uVar26) {
                                      uVar20 = uVar26;
                                    }
                                    sVar13 = sVar13 + 1;
                                    local_d8 = lVar10 + 4;
                                    if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar13)) {
LAB_001f8e8b:
                                      if (sVar13 != __nmemb) {
                                        uVar3 = array[lVar23 + sVar13];
                                        uVar26 = (uint)uVar3;
                                        if ((short)uVar3 < (short)uVar31) {
                                          uVar31 = uVar26;
                                        }
                                        uVar21 = uVar26;
                                        if ((short)uVar3 <= (short)uVar20) {
                                          uVar21 = uVar20;
                                        }
                                        sVar13 = sVar13 + 1;
                                        local_d8 = lVar10 + 5;
                                        uVar20 = uVar21;
                                        if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar13)) {
LAB_001f8f11:
                                          if (sVar13 != __nmemb) {
                                            uVar3 = array[lVar23 + sVar13];
                                            local_94 = (uint)uVar3;
                                            if ((short)uVar3 < (short)uVar31) {
                                              uVar31 = local_94;
                                            }
                                            uVar20 = local_94;
                                            if ((short)uVar3 <= (short)uVar21) {
                                              uVar20 = uVar21;
                                            }
                                            sVar13 = sVar13 + 1;
                                            local_d8 = lVar10 + 6;
                                            if ((nullcheck == 0) || ((long)__nmemb <= (long)sVar13))
                                            {
LAB_001f8f78:
                                              if (sVar13 != __nmemb) {
                                                uVar3 = array[lVar23 + sVar13];
                                                local_4c = (uint)uVar3;
                                                if ((short)uVar3 < (short)uVar31) {
                                                  uVar31 = local_4c;
                                                }
                                                uVar21 = local_4c;
                                                if ((short)uVar3 <= (short)uVar20) {
                                                  uVar21 = uVar20;
                                                }
                                                sVar13 = sVar13 + 1;
                                                local_d8 = lVar10 + 7;
                                                uVar20 = uVar21;
                                                if ((nullcheck == 0) ||
                                                   ((long)__nmemb <= (long)sVar13)) {
LAB_001f8fc6:
                                                  if (sVar13 != __nmemb) {
                                                    uVar3 = array[lVar23 + sVar13];
                                                    local_d8 = lVar10 + 8;
                                                    local_70 = (uint)uVar3;
                                                    if ((short)uVar3 < (short)uVar31) {
                                                      uVar31 = local_70;
                                                    }
                                                    uVar20 = local_70;
                                                    if ((short)uVar3 <= (short)uVar21) {
                                                      uVar20 = uVar21;
                                                    }
                                                    sVar13 = sVar13 + 1;
                                                    if ((long)sVar13 < (long)__nmemb) {
                                                      local_68 = 0;
                                                      local_48 = 0;
                                                      uVar21 = (uint)uVar19;
                                                      uVar27 = (uint)uVar2;
                                                      uVar32 = (uint)uVar1;
                                                      do {
                                                        uVar25 = uVar27;
                                                        uVar27 = uVar26;
                                                        uVar7 = local_4c;
                                                        uVar26 = local_94;
                                                        local_4c = local_70;
                                                        uVar19 = (ushort)uVar21;
                                                        if ((nullcheck != 0) &&
                                                           ((long)sVar13 < (long)__nmemb)) {
                                                          while (psVar34[sVar13] == nullvalue) {
                                                            sVar13 = sVar13 + 1;
                                                            if (__nmemb - sVar13 == 0)
                                                            goto LAB_001f9196;
                                                          }
                                                        }
                                                        if (sVar13 == __nmemb) break;
                                                        sVar30 = array[lVar23 + sVar13];
                                                        local_70 = (uint)sVar30;
                                                        if (sVar30 < (short)uVar31) {
                                                          uVar31 = local_70;
                                                        }
                                                        if ((short)uVar20 < sVar30) {
                                                          uVar20 = local_70;
                                                        }
                                                        sVar24 = (short)uVar27;
                                                        iVar9 = (int)sVar24;
                                                        sVar30 = (short)local_94;
                                                        sVar18 = (short)uVar7;
                                                        if (sVar18 != sVar30 || sVar24 != sVar30) {
                                                          iVar22 = iVar9 - sVar18;
                                                          iVar8 = -iVar22;
                                                          if (0 < iVar22) {
                                                            iVar8 = iVar22;
                                                          }
                                                          *(int *)((long)pdVar11 + local_48 * 4) =
                                                               iVar8;
                                                          local_48 = local_48 + 1;
                                                        }
                                                        local_94 = uVar7;
                                                        sVar6 = (short)uVar25;
                                                        if (((sVar6 == sVar24 &&
                                                             (short)uVar32 == sVar6) &&
                                                            sVar24 == sVar30) && sVar18 == sVar30) {
                                                          local_d8 = local_d8 + 1;
                                                        }
                                                        else {
                                                          iVar29 = (int)sVar18 + (int)(short)uVar32;
                                                          iVar22 = iVar9 * 2 - iVar29;
                                                          iVar8 = -iVar22;
                                                          if (0 < iVar22) {
                                                            iVar8 = iVar22;
                                                          }
                                                          *(int *)((long)arr + local_68 * 4) = iVar8
                                                          ;
                                                          iVar8 = (int)(short)uVar15 + iVar9 * 6 +
                                                                  iVar29 * -4 + local_70;
                                                          iVar9 = -iVar8;
                                                          if (0 < iVar8) {
                                                            iVar9 = iVar8;
                                                          }
                                                          *(int *)((long)arr_00 + local_68 * 4) =
                                                               iVar9;
                                                          local_68 = local_68 + 1;
                                                        }
                                                        sVar13 = sVar13 + 1;
                                                        uVar21 = uVar32;
                                                        uVar15 = uVar19;
                                                        uVar32 = uVar25;
                                                      } while ((long)sVar13 < (long)__nmemb);
LAB_001f9196:
                                                      local_d8 = local_d8 + local_68;
                                                      if (local_68 != 0) {
                                                        if (local_68 == 1) {
                                                          if (local_48 == 1) {
                                                            __ptr_00[local_78] =
                                                                 (double)*(int *)pdVar11;
                                                            local_78 = local_78 + 1;
                                                          }
                                                          __base[local_60] = (double)*(int *)arr;
                                                          iVar9 = *(int *)arr_00;
                                                        }
                                                        else {
                                                          iVar9 = (int)local_68;
                                                          if (1 < local_48) {
                                                            iVar8 = quick_select_int((int *)pdVar11,
                                                                                     iVar9);
                                                            __ptr_00[local_78] = (double)iVar8;
                                                            local_78 = local_78 + 1;
                                                          }
                                                          iVar8 = quick_select_int((int *)arr,iVar9)
                                                          ;
                                                          __base[local_60] = (double)iVar8;
                                                          iVar9 = quick_select_int((int *)arr_00,
                                                                                   iVar9);
                                                        }
                                                        __base_00[local_60] = (double)iVar9;
                                                        local_60 = local_60 + 1;
                                                      }
                                                    }
                                                  }
                                                }
                                                else {
                                                  do {
                                                    if (psVar34[sVar13] != nullvalue)
                                                    goto LAB_001f8fc6;
                                                    sVar13 = sVar13 + 1;
                                                  } while (__nmemb - sVar13 != 0);
                                                }
                                              }
                                            }
                                            else {
                                              do {
                                                if (psVar34[sVar13] != nullvalue) goto LAB_001f8f78;
                                                sVar13 = sVar13 + 1;
                                              } while (__nmemb - sVar13 != 0);
                                            }
                                          }
                                        }
                                        else {
                                          do {
                                            if (psVar34[sVar13] != nullvalue) goto LAB_001f8f11;
                                            sVar13 = sVar13 + 1;
                                          } while (__nmemb - sVar13 != 0);
                                        }
                                      }
                                    }
                                    else {
                                      do {
                                        if (psVar34[sVar13] != nullvalue) goto LAB_001f8e8b;
                                        sVar13 = sVar13 + 1;
                                      } while (__nmemb - sVar13 != 0);
                                    }
                                  }
                                }
                                else {
                                  do {
                                    if (psVar34[sVar13] != nullvalue) goto LAB_001f8e3a;
                                    sVar13 = sVar13 + 1;
                                  } while (__nmemb - sVar13 != 0);
                                }
                              }
                            }
                            else {
                              do {
                                if (psVar34[sVar13] != nullvalue) goto LAB_001f8de1;
                                sVar13 = sVar13 + 1;
                              } while (__nmemb - sVar13 != 0);
                            }
                          }
                        }
                      }
                    }
                    else {
                      sVar13 = 0;
                      do {
                        if (psVar34[sVar13] != nullvalue) goto LAB_001f8d30;
                        sVar13 = sVar13 + 1;
                      } while (__nmemb - sVar13 != 0);
                    }
                    sVar18 = (short)uVar20;
                    sVar30 = (short)uVar31;
                    sVar14 = sVar14 + 1;
                    psVar34 = psVar34 + __nmemb;
                    lVar10 = local_d8;
                  } while (sVar14 != sVar12);
                  if (local_60 == 0) {
                    dVar35 = 0.0;
                    dStack_b0 = 0.0;
                  }
                  else if (local_60 == 1) {
                    dVar35 = *__base;
                    dStack_b0 = *__base_00;
                  }
                  else {
                    qsort(__base,local_60,8,FnCompare_double);
                    qsort(__base_00,local_60,8,FnCompare_double);
                    lVar10 = ((local_60 - ((long)(local_60 - 1) >> 0x3f)) - 1 & 0x3ffffffffffffffe)
                             * 4;
                    lVar23 = (local_60 - ((long)local_60 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                    dVar35 = (*(double *)((long)__base + lVar23) +
                             *(double *)((long)__base + lVar10)) * 0.5;
                    dStack_b0 = (*(double *)((long)__base_00 + lVar23) +
                                *(double *)((long)__base_00 + lVar10)) * 0.5;
                  }
                  dVar36 = 0.0;
                  if (local_78 != 0) {
                    if (local_78 == 1) {
                      dVar36 = *__ptr_00;
                    }
                    else {
                      auVar4._8_4_ = SUB84(dStack_b0,0);
                      auVar4._0_8_ = dVar35;
                      auVar4._12_4_ = (int)((ulong)dStack_b0 >> 0x20);
                      qsort(__ptr_00,local_78,8,FnCompare_double);
                      dStack_b0 = auVar4._8_8_;
                      dVar36 = (*(double *)
                                 ((long)__ptr_00 +
                                 ((local_78 - ((long)(local_78 - 1) >> 0x3f)) - 1 &
                                 0xfffffffffffffffe) * 4) +
                               *(double *)
                                ((long)__ptr_00 +
                                (local_78 - ((long)local_78 >> 0x3f) & 0xfffffffffffffffe) * 4)) *
                               0.5;
                    }
                  }
                }
                dVar36 = dVar36 * 1.0483579;
                dVar35 = dVar35 * 0.6052697;
                dStack_b0 = dStack_b0 * 0.1772048;
                free(__base_00);
                free(__base);
                free(__ptr_00);
                free(arr_00);
                free(arr);
                free(pdVar11);
                goto LAB_001f93d4;
              }
              free(pdVar11);
              free(arr);
              free(arr_00);
              free(__ptr_00);
              pdVar11 = __base;
            }
          }
        }
      }
      free(pdVar11);
    }
    *status = 0x71;
    dVar35 = 0.0;
    dStack_b0 = 0.0;
    dVar36 = 0.0;
    sVar30 = 0;
    sVar18 = 0;
  }
LAB_001f93d4:
  if (ngoodpix != (long *)0x0) {
    *ngoodpix = local_d8;
  }
  if (minvalue != (short *)0x0) {
    *minvalue = sVar30;
  }
  if (maxvalue != (short *)0x0) {
    *maxvalue = sVar18;
  }
  if (noise2 != (double *)0x0) {
    *noise2 = dVar36;
  }
  if (noise3 != (double *)0x0) {
    *noise3 = dVar35;
  }
  if (noise5 != (double *)0x0) {
    *noise5 = dStack_b0;
  }
LAB_001f9418:
  return *status;
}

Assistant:

int fits_img_stats_short(short *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	short nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	short *minvalue,    /* returned minimum non-null value in the array */
	short *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input short integer image.
*/
{
	long ngood;
	short minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_short(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_short(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_short(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}